

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStg.c
# Opt level: O2

Gia_Man_t * Gia_ManStgOneHot(Vec_Int_t *vLines,int nIns,int nOuts,int nStates)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Gia_Man_t *p;
  Vec_Int_t *pVVar5;
  Vec_Int_t *p_00;
  Vec_Vec_t *p_01;
  Vec_Vec_t *p_02;
  Gia_Man_t *p_03;
  byte bVar6;
  char *pcVar7;
  int iVar8;
  uint nCap;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  
  if ((vLines->nSize & 3) != 0) {
    __assert_fail("Vec_IntSize(vLines) % 4 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                  ,0x143,"Gia_Man_t *Gia_ManStgOneHot(Vec_Int_t *, int, int, int)");
  }
  pcVar7 = (char *)0x2710;
  p = Gia_ManStart(10000);
  pcVar7 = Abc_UtilStrsav(pcVar7);
  p->pName = pcVar7;
  iVar8 = 0;
  if (0 < nStates + nIns) {
    iVar8 = nStates + nIns;
  }
  while (bVar11 = iVar8 != 0, iVar8 = iVar8 + -1, bVar11) {
    Gia_ManAppendCi(p);
  }
  Gia_ManHashAlloc(p);
  bVar6 = (byte)nIns & 0x1f;
  nCap = 1 << bVar6;
  pVVar5 = Vec_IntAlloc(nCap);
  uVar3 = 0;
  uVar9 = 0;
  if (0 < nIns) {
    uVar9 = nIns;
  }
  uVar10 = 0;
  if (0 < 1 << bVar6) {
    uVar10 = nCap;
  }
  for (; uVar3 != uVar10; uVar3 = uVar3 + 1) {
    iVar8 = 1;
    uVar1 = 0;
    while (uVar9 != uVar1) {
      iVar2 = Abc_Var2Lit(uVar1 + 1,(uint)((~uVar3 >> (uVar1 & 0x1f) & 1) != 0));
      iVar8 = Gia_ManHashAnd(p,iVar8,iVar2);
      uVar1 = uVar1 + 1;
    }
    Vec_IntPush(pVVar5,iVar8);
  }
  p_00 = Vec_IntAlloc(nStates);
  iVar2 = 0;
  iVar8 = 0;
  if (0 < nStates) {
    iVar8 = nStates;
  }
  for (; iVar8 != iVar2; iVar2 = iVar2 + 1) {
    iVar4 = Abc_Var2Lit(nIns + 1 + iVar2,(uint)(iVar2 == 0));
    Vec_IntPush(p_00,iVar4);
  }
  p_01 = Vec_VecStart(nStates);
  p_02 = Vec_VecStart(nOuts);
  bVar6 = (byte)nOuts;
  uVar9 = 0;
  if (nOuts < 1) {
    nOuts = 0;
  }
  while( true ) {
    if (vLines->nSize <= (int)uVar9) {
      Vec_IntFree(pVVar5);
      Vec_IntFree(p_00);
      iVar8 = p_02->nSize;
      iVar2 = 0;
      if (iVar8 < 1) {
        iVar8 = 0;
      }
      for (; iVar8 != iVar2; iVar2 = iVar2 + 1) {
        pVVar5 = Vec_VecEntryInt(p_02,iVar2);
        iVar4 = Gia_ManCreateOrGate(p,pVVar5);
        Gia_ManAppendCo(p,iVar4);
      }
      Vec_VecFree(p_02);
      iVar8 = p_01->nSize;
      iVar2 = 0;
      if (iVar8 < 1) {
        iVar8 = 0;
      }
      for (; iVar8 != iVar2; iVar2 = iVar2 + 1) {
        pVVar5 = Vec_VecEntryInt(p_01,iVar2);
        iVar4 = Gia_ManCreateOrGate(p,pVVar5);
        iVar4 = Abc_LitNotCond(iVar4,(uint)(iVar2 == 0));
        Gia_ManAppendCo(p,iVar4);
      }
      Vec_VecFree(p_01);
      Gia_ManSetRegNum(p,nStates);
      Gia_ManHashStop(p);
      p_03 = Gia_ManCleanup(p);
      Gia_ManStop(p);
      iVar8 = Gia_ManHasDangling(p_03);
      if (iVar8 != 0) {
        __assert_fail("!Gia_ManHasDangling(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                      ,0x188,"Gia_Man_t *Gia_ManStgOneHot(Vec_Int_t *, int, int, int)");
      }
      return p_03;
    }
    iVar8 = Vec_IntEntry(vLines,uVar9);
    iVar2 = Vec_IntEntry(vLines,uVar9 | 1);
    iVar4 = Vec_IntEntry(vLines,uVar9 | 2);
    uVar3 = Vec_IntEntry(vLines,uVar9 | 3);
    if ((iVar8 < 0) || ((int)nCap <= iVar8)) {
      __assert_fail("iMint >= 0 && iMint < (1<<nIns)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                    ,0x163,"Gia_Man_t *Gia_ManStgOneHot(Vec_Int_t *, int, int, int)");
    }
    if ((iVar2 < 1) || (nStates < iVar2)) break;
    if ((iVar4 < 1) || (nStates < iVar4)) {
      __assert_fail("iNext >= 0 && iNext < nStates",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                    ,0x165,"Gia_Man_t *Gia_ManStgOneHot(Vec_Int_t *, int, int, int)");
    }
    if (((int)uVar3 < 0) || (1 << (bVar6 & 0x1f) <= (int)uVar3)) {
      __assert_fail("iOut >= 0 && iOut < (1<<nOuts)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                    ,0x166,"Gia_Man_t *Gia_ManStgOneHot(Vec_Int_t *, int, int, int)");
    }
    uVar9 = uVar9 + 4;
    iVar8 = Vec_IntEntry(pVVar5,iVar8);
    iVar2 = Vec_IntEntry(p_00,iVar2 + -1);
    iVar8 = Gia_ManHashAnd(p,iVar8,iVar2);
    Vec_VecPushInt(p_01,iVar4 + -1,iVar8);
    for (uVar10 = 0; nOuts != uVar10; uVar10 = uVar10 + 1) {
      if ((uVar3 >> (uVar10 & 0x1f) & 1) != 0) {
        Vec_VecPushInt(p_02,uVar10,iVar8);
      }
    }
  }
  __assert_fail("iCur >= 0 && iCur < nStates",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                ,0x164,"Gia_Man_t *Gia_ManStgOneHot(Vec_Int_t *, int, int, int)");
}

Assistant:

Gia_Man_t * Gia_ManStgOneHot( Vec_Int_t * vLines, int nIns, int nOuts, int nStates )
{
    Gia_Man_t * p, * pTemp;
    Vec_Int_t * vInMints, * vCurs, * vVec;
    Vec_Vec_t * vLitsNext, * vLitsOuts;
    int i, b, LitC, Lit;
    assert( Vec_IntSize(vLines) % 4 == 0 );

    // start manager
    p = Gia_ManStart( 10000 );
    p->pName = Abc_UtilStrsav( "stg" );
    for ( i = 0; i < nIns + nStates; i++ )
        Gia_ManAppendCi(p);

    // create input minterms
    Gia_ManHashAlloc( p );
    vInMints = Vec_IntAlloc( 1 << nIns );
    for ( i = 0; i < (1 << nIns); i++ )
    {
        for ( Lit = 1, b = 0; b < nIns; b++ )
            Lit = Gia_ManHashAnd( p, Lit, Abc_Var2Lit( b+1, !((i >> b) & 1) ) );
        Vec_IntPush( vInMints, Lit );
    } 

    // create current states
    vCurs  = Vec_IntAlloc( nStates );
    for ( i = 0; i < nStates; i++ )
        Vec_IntPush( vCurs, Abc_Var2Lit( 1+nIns+i, !i ) );

    // go through the lines
    vLitsNext = Vec_VecStart( nStates );
    vLitsOuts = Vec_VecStart( nOuts );
    for ( i = 0; i < Vec_IntSize(vLines); )
    {
        int iMint = Vec_IntEntry(vLines, i++);
        int iCur  = Vec_IntEntry(vLines, i++) - 1;
        int iNext = Vec_IntEntry(vLines, i++) - 1;
        int iOut  = Vec_IntEntry(vLines, i++);
        assert( iMint >= 0 && iMint < (1<<nIns)  );
        assert( iCur  >= 0 && iCur  < nStates    );
        assert( iNext >= 0 && iNext < nStates    );
        assert( iOut  >= 0 && iOut  < (1<<nOuts) );
        // create condition
        LitC = Gia_ManHashAnd( p, Vec_IntEntry(vInMints, iMint), Vec_IntEntry(vCurs, iCur) );
        // update next state
//        Lit = Gia_ManHashOr( p, LitC, Vec_IntEntry(vNexts, iNext) );
//        Vec_IntWriteEntry( vNexts, iNext, Lit );
        Vec_VecPushInt( vLitsNext, iNext, LitC );
        // update outputs
        for ( b = 0; b < nOuts; b++ )
            if ( (iOut >> b) & 1 ) 
            {
//                Lit = Gia_ManHashOr( p, LitC, Vec_IntEntry(vOuts, b) );
//                Vec_IntWriteEntry( vOuts, b, Lit );
                Vec_VecPushInt( vLitsOuts, b, LitC );
            }
    }
    Vec_IntFree( vInMints );
    Vec_IntFree( vCurs );

    // create POs
    Vec_VecForEachLevelInt( vLitsOuts, vVec, i )
        Gia_ManAppendCo( p, Gia_ManCreateOrGate(p, vVec) );
    Vec_VecFree( vLitsOuts );

    // create next states
    Vec_VecForEachLevelInt( vLitsNext, vVec, i )
        Gia_ManAppendCo( p, Abc_LitNotCond( Gia_ManCreateOrGate(p, vVec), !i ) );
    Vec_VecFree( vLitsNext );

    Gia_ManSetRegNum( p, nStates );
    Gia_ManHashStop( p );

    p = Gia_ManCleanup( pTemp = p );
    Gia_ManStop( pTemp );
    assert( !Gia_ManHasDangling(p) );
    return p;
}